

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O2

SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> * __thiscall
de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_>::operator=
          (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *this,
          SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>_> *other)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  
  if (this->m_state != other->m_state) {
    release(this);
    this->m_ptr = other->m_ptr;
    pSVar2 = other->m_state;
    this->m_state = pSVar2;
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar2->strongRefCount = pSVar2->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &this->m_state->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  return this;
}

Assistant:

inline SharedPtr<T>& SharedPtr<T>::operator= (const SharedPtr<T>& other)
{
	if (m_state == other.m_state)
		return *this;

	// Release current reference.
	release();

	// Copy from other and acquire reference.
	m_ptr	= other.m_ptr;
	m_state	= other.m_state;

	acquire();

	return *this;
}